

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

void ON_MathError(char *sModuleName,char *sErrorType,char *sFunctionName)

{
  char *local_20;
  char *sFunctionName_local;
  char *sErrorType_local;
  char *sModuleName_local;
  
  ON_MATH_ERROR_COUNT = ON_MATH_ERROR_COUNT + 1;
  sErrorType_local = sModuleName;
  if (sModuleName == (char *)0x0) {
    sErrorType_local = "";
  }
  sFunctionName_local = sErrorType;
  if (sErrorType == (char *)0x0) {
    sFunctionName_local = "";
  }
  local_20 = sFunctionName;
  if (sFunctionName == (char *)0x0) {
    local_20 = "";
  }
  if (((*sErrorType_local == '\0') && (*sFunctionName_local == '\0')) && (*local_20 == '\0')) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_error.cpp"
               ,0x6b,local_20,"Math library or floating point ERROR # %d",
               (ulong)(uint)ON_MATH_ERROR_COUNT);
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_error.cpp"
               ,0x61,local_20,
               "Math library or floating point ERROR # %d module=%s type=%s function=%s",
               (ulong)(uint)ON_MATH_ERROR_COUNT,sErrorType_local,sFunctionName_local,local_20);
  }
  return;
}

Assistant:

void ON_MathError( 
        const char* sModuleName,
        const char* sErrorType,
        const char* sFunctionName
        )
{
  ON_MATH_ERROR_COUNT++;

  if ( 0 == sModuleName)
    sModuleName = "";
  if ( 0 == sErrorType )
    sErrorType = "";
  if ( 0 == sFunctionName )
    sFunctionName = "";

  if ( 0 != sModuleName[0] || 0 != sErrorType[0] || 0 != sFunctionName[0] )
  {
    ON_ErrorEx(__FILE__,__LINE__,sFunctionName,
              "Math library or floating point ERROR # %d module=%s type=%s function=%s",
              ON_MATH_ERROR_COUNT, 
              sModuleName, // rhino.exe, opennurbs.dll, etc.
              sErrorType,   
              sFunctionName
              );
  }
  else
  {
    ON_ErrorEx(__FILE__,__LINE__,sFunctionName,
              "Math library or floating point ERROR # %d",
              ON_MATH_ERROR_COUNT
              );
  }
}